

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_1UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_1UL>
      *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                 &output[1].exception.ptr.field_1.value);
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         (char *)other[1].field_1.value.ownFile.content.size_;
    other[1].field_1.value.ownFile.content.size_ = 0;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
               &output[1].exception.ptr.field_1.value);
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }